

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::internal::KeyMapBase<unsigned_long>::InsertUnique
          (KeyMapBase<unsigned_long> *this,map_index_t b,KeyNode *node)

{
  uint uVar1;
  NodeBase **ppNVar2;
  NodeBase *pNVar3;
  ulong uVar4;
  uintptr_t v;
  NodeAndBucket NVar5;
  
  uVar1 = (this->super_UntypedMapBase).index_of_first_non_null_;
  if ((uVar1 == (this->super_UntypedMapBase).num_buckets_) ||
     ((this->super_UntypedMapBase).table_[uVar1] != (NodeBase *)0x0)) {
    NVar5 = FindHelper(this,(ViewType_conflict)node[1].super_NodeBase.next);
    if (NVar5.node == (NodeBase *)0x0) {
      AssertLoadFactor(this);
      ppNVar2 = (this->super_UntypedMapBase).table_;
      pNVar3 = ppNVar2[b];
      if (pNVar3 == (NodeBase *)0x0) {
        ppNVar2[b] = &node->super_NodeBase;
        (node->super_NodeBase).next = (NodeBase *)0x0;
        uVar1 = (this->super_UntypedMapBase).index_of_first_non_null_;
        if (uVar1 < b) {
          b = uVar1;
        }
        (this->super_UntypedMapBase).index_of_first_non_null_ = b;
      }
      else {
        uVar4 = ((ulong)node ^ 0x35c9b0) * -0x234dd359734ecb13;
        uVar4 = ((uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                  (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                  (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28
                 | uVar4 << 0x38) ^ (ulong)node) * -0x234dd359734ecb13;
        uVar4 = ((uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                  (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                  (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28
                 | uVar4 << 0x38) ^ (ulong)ppNVar2) * -0x234dd359734ecb13;
        uVar4 = ((uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                  (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                  (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28
                 | uVar4 << 0x38) ^ (ulong)ppNVar2) * -0x234dd359734ecb13;
        if ((uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
             (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
             (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38) % 0xd < 7) {
          (node->super_NodeBase).next = pNVar3;
          ppNVar2[b] = &node->super_NodeBase;
        }
        else {
          (node->super_NodeBase).next = pNVar3->next;
          ppNVar2[b]->next = &node->super_NodeBase;
        }
      }
      return;
    }
    InsertUnique((KeyMapBase<unsigned_long> *)&stack0xffffffffffffffd8);
  }
  InsertUnique((KeyMapBase<unsigned_long> *)&stack0xffffffffffffffd8);
}

Assistant:

void InsertUnique(map_index_t b, KeyNode* node) {
    ABSL_DCHECK(index_of_first_non_null_ == num_buckets_ ||
                table_[index_of_first_non_null_] != nullptr);
    // In practice, the code that led to this point may have already
    // determined whether we are inserting into an empty list, a short list,
    // or whatever.  But it's probably cheap enough to recompute that here;
    // it's likely that we're inserting into an empty or short list.
    ABSL_DCHECK(FindHelper(TS::ToView(node->key())).node == nullptr);
    AssertLoadFactor();
    auto*& head = table_[b];
    if (head == nullptr) {
      head = node;
      node->next = nullptr;
      index_of_first_non_null_ = (std::min)(index_of_first_non_null_, b);
    } else if (ShouldInsertAfterHead(node)) {
      node->next = head->next;
      head->next = node;
    } else {
      node->next = head;
      head = node;
    }
  }